

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *addtlInfo;
  TTD_PTR_ID TVar3;
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *aInfo;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapObject *snpObject_local;
  
  addtlInfo = SlabAllocatorBase<0>::
              SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo>
                        (alloc);
  (*reader->_vptr_FileReader[3])(reader,3,1);
  NSSnapValues::ParsePromiseCapabilityInfo(&addtlInfo->Capabilities,false,reader,alloc);
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  addtlInfo->Index = uVar1;
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->RemainingElementsWrapperId = TVar3;
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  addtlInfo->RemainingElementsValue = uVar1;
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->AlreadyCalledWrapperId = TVar3;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->AlreadyCalledValue = (bool)((byte)iVar2 & 1);
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->IsRejecting = (bool)((byte)iVar2 & 1);
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->Values = TVar3;
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)32>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = alloc.SlabAllocateStruct<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo>();

            reader->ReadKey(NSTokens::Key::entry, true);
            NSSnapValues::ParsePromiseCapabilityInfo(&aInfo->Capabilities, false, reader, alloc);

            aInfo->Index = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            aInfo->RemainingElementsWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            aInfo->RemainingElementsValue = reader->ReadUInt32(NSTokens::Key::u32Val, true);

            aInfo->AlreadyCalledWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            aInfo->AlreadyCalledValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            aInfo->IsRejecting = reader->ReadBool(NSTokens::Key::boolVal, true);
            aInfo->Values = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);

            SnapObjectSetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject, aInfo);
        }